

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

bool __thiscall bitfoot::Bitfoot::AttackedBy<false>(Bitfoot *this,int sqr)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  bool local_31;
  uint64_t RQ;
  uint64_t BQ;
  int sqr_local;
  Bitfoot *this_local;
  
  if ((sqr & 0xffffffc0U) != 0) {
    __assert_fail("IS_SQUARE(sqr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0x2b6,"bool bitfoot::Bitfoot::AttackedBy(const int) const [color = false]");
  }
  uVar2 = this->pc[6] | this->pc[10];
  uVar3 = this->pc[8] | this->pc[10];
  local_31 = true;
  if ((((*(ulong *)(_PAWN_ATK + (long)sqr * 8 + 0x200) & this->pc[2]) == 0) &&
      (local_31 = true, (*(ulong *)(_KNIGHT_ATK + (long)sqr * 8) & this->pc[4]) == 0)) &&
     (local_31 = true, (*(ulong *)(_KING_ATK + (long)sqr * 8) & this->pc[0xc]) == 0)) {
    uVar1 = NorthX(this,sqr);
    local_31 = true;
    if ((uVar1 & uVar3) == 0) {
      uVar1 = EastX(this,sqr);
      local_31 = true;
      if ((uVar1 & uVar3) == 0) {
        uVar1 = NorthEastX(this,sqr);
        local_31 = true;
        if ((uVar1 & uVar2) == 0) {
          uVar1 = NorthWestX(this,sqr);
          local_31 = true;
          if ((uVar1 & uVar2) == 0) {
            uVar1 = WestX(this,sqr);
            local_31 = true;
            if ((uVar1 & uVar3) == 0) {
              uVar1 = SouthX(this,sqr);
              local_31 = true;
              if ((uVar1 & uVar3) == 0) {
                uVar1 = SouthEastX(this,sqr);
                local_31 = true;
                if ((uVar1 & uVar2) == 0) {
                  uVar1 = SouthWestX(this,sqr);
                  local_31 = (uVar1 & uVar2) != 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_31;
}

Assistant:

inline bool AttackedBy(const int sqr) const {
    assert(IS_SQUARE(sqr));
    const uint64_t BQ = (pc[color|Bishop] | pc[color|Queen]);
    const uint64_t RQ = (pc[color|Rook] | pc[color|Queen]);
    return ((_PAWN_ATK[!color][sqr] & pc[color|Pawn]) ||
            (_KNIGHT_ATK[sqr] & pc[color|Knight]) ||
            (_KING_ATK[sqr] & pc[color|King]) ||
            (NorthX(sqr) & RQ) ||
            (EastX(sqr) & RQ) ||
            (NorthEastX(sqr) & BQ) ||
            (NorthWestX(sqr) & BQ) ||
            (WestX(sqr) & RQ) ||
            (SouthX(sqr) & RQ) ||
            (SouthEastX(sqr) & BQ) ||
            (SouthWestX(sqr) & BQ));
  }